

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSendString(HelicsEndpoint endpoint,char *message,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  char *local_40;
  data_view local_38;
  
  local_40 = message;
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    if (message == (char *)0x0) {
      local_38.dblock._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      local_38.dblock._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::Endpoint::send
                (this,(int)&local_38,__buf,(size_t)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 in_R8D);
    }
    else {
      helics::data_view::data_view<char_const*&,void>(&local_38,&local_40);
      helics::Endpoint::send(this,(int)&local_38,__buf_00,in_RCX,in_R8D);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void helicsEndpointSendString(HelicsEndpoint endpoint, const char* message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if (message == nullptr) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(message);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}